

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_cont_4d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3)

{
  int64_t iVar1;
  ggml_tensor *tensor;
  long in_RCX;
  long in_RDX;
  ggml_tensor *in_RSI;
  int64_t in_RDI;
  long in_R8;
  long in_R9;
  ggml_tensor *result;
  
  iVar1 = ggml_nelements(in_RSI);
  if (iVar1 != in_RDX * in_RCX * in_R8 * in_R9) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xbe6
               ,"GGML_ASSERT(%s) failed","ggml_nelements(a) == (ne0*ne1*ne2*ne3)");
  }
  tensor = ggml_new_tensor_4d((ggml_context *)ne2,ne3._4_4_,(int64_t)result,in_RDI,(int64_t)in_RSI,
                              in_RDX);
  ggml_format_name(tensor,"%s (cont)",in_RSI->name);
  tensor->op = GGML_OP_CONT;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_cont_4d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3) {
    GGML_ASSERT(ggml_nelements(a) == (ne0*ne1*ne2*ne3));

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type, ne0, ne1, ne2, ne3);
    ggml_format_name(result, "%s (cont)", a->name);

    result->op     = GGML_OP_CONT;
    result->src[0] = a;

    return result;
}